

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O3

void __thiscall
UnicodeFullTest_equals_Test<std::pair<char8_t,_char8_t>_>::TestBody
          (UnicodeFullTest_equals_Test<std::pair<char8_t,_char8_t>_> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
  *paVar2;
  _Alloc_hider _Var3;
  int iVar4;
  char32_t (*in_RDX) [5];
  char32_t (*in_string) [5];
  char32_t (*extraout_RDX) [5];
  char32_t (*extraout_RDX_00) [5];
  char32_t (*extraout_RDX_01) [5];
  char32_t (*extraout_RDX_02) [5];
  char32_t (*extraout_RDX_03) [5];
  char32_t (*extraout_RDX_04) [5];
  char32_t (*extraout_RDX_05) [5];
  char32_t (*in_string_00) [5];
  char32_t (*extraout_RDX_06) [5];
  char32_t (*extraout_RDX_07) [5];
  char32_t (*extraout_RDX_08) [5];
  char32_t (*extraout_RDX_09) [5];
  char32_t (*extraout_RDX_10) [5];
  char32_t (*extraout_RDX_11) [5];
  char32_t (*extraout_RDX_12) [5];
  char32_t (*in_string_01) [5];
  char32_t (*extraout_RDX_13) [5];
  char32_t (*extraout_RDX_14) [5];
  char32_t (*extraout_RDX_15) [5];
  char32_t (*extraout_RDX_16) [5];
  char32_t (*extraout_RDX_17) [5];
  char32_t (*extraout_RDX_18) [5];
  char32_t (*extraout_RDX_19) [5];
  char32_t (*in_string_02) [5];
  char32_t (*extraout_RDX_20) [5];
  char32_t (*extraout_RDX_21) [5];
  char32_t (*extraout_RDX_22) [5];
  char32_t (*extraout_RDX_23) [5];
  char32_t (*extraout_RDX_24) [5];
  char32_t (*extraout_RDX_25) [5];
  char32_t (*pacVar5) [5];
  char32_t (*extraout_RDX_26) [5];
  char32_t (*in_string_03) [5];
  _Alloc_hider _Var6;
  char cVar7;
  pointer *__ptr;
  AssertHelper local_80 [8];
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_78;
  char local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_48;
  
  jessilib::string_cast<char8_t,char32_t[5]>(&local_78,(jessilib *)L"ABCD",in_RDX);
  jessilib::string_cast<char8_t,char32_t[5]>(&local_48,(jessilib *)L"ABCD",in_string);
  _Var3._M_p = local_48._M_dataplus._M_p;
  _Var6._M_p = local_78._M_dataplus._M_p;
  pacVar5 = (char32_t (*) [5])local_78._M_string_length;
  if (local_78._M_string_length == local_48._M_string_length) {
    if ((char32_t (*) [5])local_78._M_string_length != (char32_t (*) [5])0x0) {
      iVar4 = bcmp(local_78._M_dataplus._M_p,local_48._M_dataplus._M_p,local_78._M_string_length);
      pacVar5 = extraout_RDX;
      if (iVar4 != 0) goto LAB_00219885;
    }
    local_58[0] = '\x01';
  }
  else {
LAB_00219885:
    local_58[0] = '\0';
  }
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  paVar1 = &local_48.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)_Var3._M_p != paVar1) {
    operator_delete(_Var3._M_p,local_48.field_2._M_allocated_capacity + 1);
    pacVar5 = extraout_RDX_00;
    _Var6._M_p = local_78._M_dataplus._M_p;
  }
  paVar2 = &local_78.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)_Var6._M_p != paVar2) {
    operator_delete(_Var6._M_p,local_78.field_2._M_allocated_capacity + 1);
    pacVar5 = extraout_RDX_01;
  }
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_78,local_58,
               "equals(jessilib::string_cast<typename TypeParam::first_type>(U\"ABCD\"), jessilib::string_cast<typename TypeParam::second_type>(U\"ABCD\"))"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xb0,local_78._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    pacVar5 = extraout_RDX_02;
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_78._M_dataplus._M_p != paVar2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      pacVar5 = extraout_RDX_03;
    }
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
      pacVar5 = extraout_RDX_04;
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
    pacVar5 = extraout_RDX_05;
  }
  jessilib::string_cast<char8_t,char32_t[5]>(&local_78,(jessilib *)L"abcd",pacVar5);
  jessilib::string_cast<char8_t,char32_t[5]>(&local_48,(jessilib *)L"abcd",in_string_00);
  _Var3._M_p = local_48._M_dataplus._M_p;
  _Var6._M_p = local_78._M_dataplus._M_p;
  pacVar5 = (char32_t (*) [5])local_78._M_string_length;
  if (local_78._M_string_length == local_48._M_string_length) {
    if ((char32_t (*) [5])local_78._M_string_length != (char32_t (*) [5])0x0) {
      iVar4 = bcmp(local_78._M_dataplus._M_p,local_48._M_dataplus._M_p,local_78._M_string_length);
      pacVar5 = extraout_RDX_06;
      if (iVar4 != 0) goto LAB_002199cc;
    }
    local_58[0] = '\x01';
  }
  else {
LAB_002199cc:
    local_58[0] = '\0';
  }
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)_Var3._M_p != paVar1) {
    operator_delete(_Var3._M_p,local_48.field_2._M_allocated_capacity + 1);
    pacVar5 = extraout_RDX_07;
    _Var6._M_p = local_78._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)_Var6._M_p != paVar2) {
    operator_delete(_Var6._M_p,local_78.field_2._M_allocated_capacity + 1);
    pacVar5 = extraout_RDX_08;
  }
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_78,local_58,
               "equals(jessilib::string_cast<typename TypeParam::first_type>(U\"abcd\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abcd\"))"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xb2,local_78._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    pacVar5 = extraout_RDX_09;
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_78._M_dataplus._M_p != paVar2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      pacVar5 = extraout_RDX_10;
    }
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
      pacVar5 = extraout_RDX_11;
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
    pacVar5 = extraout_RDX_12;
  }
  jessilib::string_cast<char8_t,char32_t[5]>(&local_78,(jessilib *)L"ABCD",pacVar5);
  jessilib::string_cast<char8_t,char32_t[5]>(&local_48,(jessilib *)L"abcd",in_string_01);
  _Var3._M_p = local_48._M_dataplus._M_p;
  _Var6._M_p = local_78._M_dataplus._M_p;
  cVar7 = '\x01';
  pacVar5 = (char32_t (*) [5])local_78._M_string_length;
  if (local_78._M_string_length == local_48._M_string_length) {
    if ((char32_t (*) [5])local_78._M_string_length != (char32_t (*) [5])0x0) {
      iVar4 = bcmp(local_78._M_dataplus._M_p,local_48._M_dataplus._M_p,local_78._M_string_length);
      pacVar5 = extraout_RDX_13;
      if (iVar4 != 0) goto LAB_00219b0f;
    }
    cVar7 = '\0';
  }
LAB_00219b0f:
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_58[0] = cVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)_Var3._M_p != paVar1) {
    operator_delete(_Var3._M_p,local_48.field_2._M_allocated_capacity + 1);
    pacVar5 = extraout_RDX_14;
    _Var6._M_p = local_78._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)_Var6._M_p != paVar2) {
    operator_delete(_Var6._M_p,local_78.field_2._M_allocated_capacity + 1);
    pacVar5 = extraout_RDX_15;
  }
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_78,local_58,
               "equals(jessilib::string_cast<typename TypeParam::first_type>(U\"ABCD\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abcd\"))"
               ,"true");
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xb4,local_78._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    pacVar5 = extraout_RDX_16;
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_78._M_dataplus._M_p != paVar2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      pacVar5 = extraout_RDX_17;
    }
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
      pacVar5 = extraout_RDX_18;
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
    pacVar5 = extraout_RDX_19;
  }
  jessilib::string_cast<char8_t,char32_t[5]>(&local_78,(jessilib *)L"abcd",pacVar5);
  jessilib::string_cast<char8_t,char32_t[5]>(&local_48,(jessilib *)L"ABCD",in_string_02);
  _Var3._M_p = local_48._M_dataplus._M_p;
  _Var6._M_p = local_78._M_dataplus._M_p;
  cVar7 = '\x01';
  pacVar5 = (char32_t (*) [5])local_78._M_string_length;
  if (local_78._M_string_length == local_48._M_string_length) {
    if ((char32_t (*) [5])local_78._M_string_length != (char32_t (*) [5])0x0) {
      iVar4 = bcmp(local_78._M_dataplus._M_p,local_48._M_dataplus._M_p,local_78._M_string_length);
      pacVar5 = extraout_RDX_20;
      if (iVar4 != 0) goto LAB_00219c4d;
    }
    cVar7 = '\0';
  }
LAB_00219c4d:
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_58[0] = cVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)_Var3._M_p != paVar1) {
    operator_delete(_Var3._M_p,local_48.field_2._M_allocated_capacity + 1);
    pacVar5 = extraout_RDX_21;
    _Var6._M_p = local_78._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)_Var6._M_p != paVar2) {
    operator_delete(_Var6._M_p,local_78.field_2._M_allocated_capacity + 1);
    pacVar5 = extraout_RDX_22;
  }
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_78,local_58,
               "equals(jessilib::string_cast<typename TypeParam::first_type>(U\"abcd\"), jessilib::string_cast<typename TypeParam::second_type>(U\"ABCD\"))"
               ,"true");
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xb6,local_78._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    pacVar5 = extraout_RDX_23;
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_78._M_dataplus._M_p != paVar2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      pacVar5 = extraout_RDX_24;
    }
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
      pacVar5 = extraout_RDX_25;
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
    pacVar5 = extraout_RDX_26;
  }
  jessilib::string_cast<char8_t,char32_t[5]>(&local_78,(jessilib *)L"ABcd",pacVar5);
  jessilib::string_cast<char8_t,char32_t[5]>(&local_48,(jessilib *)L"abCD",in_string_03);
  _Var3._M_p = local_48._M_dataplus._M_p;
  _Var6._M_p = local_78._M_dataplus._M_p;
  cVar7 = '\x01';
  if (local_78._M_string_length == local_48._M_string_length) {
    if ((char32_t (*) [5])local_78._M_string_length != (char32_t (*) [5])0x0) {
      iVar4 = bcmp(local_78._M_dataplus._M_p,local_48._M_dataplus._M_p,local_78._M_string_length);
      if (iVar4 != 0) goto LAB_00219d8b;
    }
    cVar7 = '\0';
  }
LAB_00219d8b:
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_58[0] = cVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)_Var3._M_p != paVar1) {
    operator_delete(_Var3._M_p,local_48.field_2._M_allocated_capacity + 1);
    _Var6._M_p = local_78._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)_Var6._M_p != paVar2) {
    operator_delete(_Var6._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (cVar7 == '\0') {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_78,local_58,
               "equals(jessilib::string_cast<typename TypeParam::first_type>(U\"ABcd\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abCD\"))"
               ,"true");
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xb8,local_78._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_78._M_dataplus._M_p != paVar2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
    }
    if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,local_50);
    }
  }
  return;
}

Assistant:

TYPED_TEST(UnicodeFullTest, equals) {
	// TypeParam::first_type == TypeParam::second_type
	EXPECT_TRUE(equals(jessilib::string_cast<typename TypeParam::first_type>(U"ABCD"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCD")));
	EXPECT_TRUE(equals(jessilib::string_cast<typename TypeParam::first_type>(U"abcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcd")));
	EXPECT_FALSE(equals(jessilib::string_cast<typename TypeParam::first_type>(U"ABCD"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcd")));
	EXPECT_FALSE(equals(jessilib::string_cast<typename TypeParam::first_type>(U"abcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCD")));
	EXPECT_FALSE(equals(jessilib::string_cast<typename TypeParam::first_type>(U"ABcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abCD")));
}